

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O3

void __thiscall acto::core::runtime_t::join(runtime_t *this,object_t *obj)

{
  mutex *__mutex;
  event *this_00;
  int iVar1;
  void *__stat_loc;
  long in_FS_OFFSET;
  waiter_t node;
  waiter_t local_80;
  
  if (*(char *)(in_FS_OFFSET + -8) == '\0') {
    *(undefined1 *)(in_FS_OFFSET + -8) = 1;
    __cxx_global_var_init();
  }
  if (*(object_t **)(in_FS_OFFSET + -0x50) != obj) {
    this_00 = &local_80.on_deleted;
    local_80.super_node<acto::core::object_t::waiter_t>.next = (waiter_t *)0x0;
    __stat_loc = (void *)0x0;
    event::event(this_00,false);
    __mutex = &obj->cs;
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar1 != 0) {
      std::__throw_system_error(iVar1);
    }
    if (obj->impl == (actor *)0x0) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    }
    else {
      event::reset(this_00);
      local_80.super_node<acto::core::object_t::waiter_t>.next = obj->waiters;
      obj->waiters = &local_80;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      event::wait(this_00,__stat_loc);
    }
    std::condition_variable::~condition_variable(&local_80.on_deleted.cond_);
  }
  return;
}

Assistant:

void runtime_t::join(object_t* const obj) {
  if (thread_context.active_actor == obj) {
    return;
  }

  object_t::waiter_t node;

  {
    std::lock_guard<std::mutex> g(obj->cs);

    if (obj->impl) {
      node.on_deleted.reset();
      node.next = obj->waiters;
      obj->waiters = &node;
    } else {
      return;
    }
  }

  node.on_deleted.wait();
}